

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__csctx_rmove_to(stbtt__csctx *ctx,float dx,float dy)

{
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  stbtt_int32 unaff_retaddr;
  stbtt_int32 in_stack_00000008;
  stbtt_int32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  stbtt_int32 in_stack_ffffffffffffffe4;
  stbtt_int32 in_stack_ffffffffffffffe8;
  stbtt_uint8 in_stack_ffffffffffffffef;
  
  stbtt__csctx_close_shape
            ((stbtt__csctx *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  fVar1 = *(float *)(in_RDI + 0x10) + in_XMM0_Da;
  *(float *)(in_RDI + 0x10) = fVar1;
  *(float *)(in_RDI + 8) = fVar1;
  fVar1 = *(float *)(in_RDI + 0x14) + in_XMM1_Da;
  *(float *)(in_RDI + 0x14) = fVar1;
  *(float *)(in_RDI + 0xc) = fVar1;
  stbtt__csctx_v((stbtt__csctx *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_stack_ffffffffffffffef,
                 in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,0,in_stack_ffffffffffffffdc,
                 unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

static void stbtt__csctx_rmove_to(stbtt__csctx *ctx, float dx, float dy)
{
   stbtt__csctx_close_shape(ctx);
   ctx->first_x = ctx->x = ctx->x + dx;
   ctx->first_y = ctx->y = ctx->y + dy;
   stbtt__csctx_v(ctx, STBTT_vmove, (int)ctx->x, (int)ctx->y, 0, 0, 0, 0);
}